

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,QPodPoint *p,QPodPoint *v1,QPodPoint *v2,QPodPoint *v3)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = qPointIsLeftOfLine(p,v2,v1);
  bVar2 = qPointIsLeftOfLine(p,v3,v2);
  bVar3 = qPointIsLeftOfLine(v1,v2,v3);
  if (bVar3) {
    bVar1 = !bVar1 && !bVar2;
  }
  else {
    bVar1 = !bVar1 || !bVar2;
  }
  return bVar1;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::pointIsInSector(const QPodPoint &p, const QPodPoint &v1, const QPodPoint &v2, const QPodPoint &v3)
{
    bool leftOfPreviousEdge = !qPointIsLeftOfLine(p, v2, v1);
    bool leftOfNextEdge = !qPointIsLeftOfLine(p, v3, v2);

    if (qPointIsLeftOfLine(v1, v2, v3))
        return leftOfPreviousEdge && leftOfNextEdge;
    else
        return leftOfPreviousEdge || leftOfNextEdge;
}